

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

void __thiscall capnp::DynamicValue::Pipeline::Pipeline(Pipeline *this,Pipeline *other)

{
  Type local_c;
  
  local_c = other->type;
  this->type = local_c;
  if (local_c != UNKNOWN) {
    if (local_c == CAPABILITY) {
      (this->field_1).structValue.schema.super_Schema.raw =
           (other->field_1).structValue.schema.super_Schema.raw;
      (this->field_1).structValue.typeless.hook.disposer =
           (other->field_1).structValue.typeless.hook.disposer;
      (other->field_1).structValue.typeless.hook.disposer = (Disposer *)0x0;
      (this->field_1).structValue.typeless.hook.ptr = (other->field_1).structValue.typeless.hook.ptr
      ;
    }
    else if (local_c == STRUCT) {
      (this->field_1).structValue.schema.super_Schema.raw =
           (other->field_1).structValue.schema.super_Schema.raw;
      (this->field_1).structValue.typeless.hook.disposer =
           (other->field_1).structValue.typeless.hook.disposer;
      (this->field_1).structValue.typeless.hook.ptr = (other->field_1).structValue.typeless.hook.ptr
      ;
      (other->field_1).structValue.typeless.hook.ptr = (PipelineHook *)0x0;
      (this->field_1).structValue.typeless.ops.ptr = (other->field_1).structValue.typeless.ops.ptr;
      (this->field_1).structValue.typeless.ops.size_ =
           (other->field_1).structValue.typeless.ops.size_;
      (this->field_1).structValue.typeless.ops.disposer =
           (other->field_1).structValue.typeless.ops.disposer;
      (other->field_1).structValue.typeless.ops.ptr = (PipelineOp *)0x0;
      (other->field_1).structValue.typeless.ops.size_ = 0;
    }
    else {
      if (kj::_::Debug::minSeverity < 3) {
        kj::_::Debug::log<char_const(&)[26],unsigned_int>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                   ,0x68c,ERROR,"\"Unexpected pipeline type.\", (uint)type",
                   (char (*) [26])"Unexpected pipeline type.",&local_c);
      }
      this->type = UNKNOWN;
    }
  }
  return;
}

Assistant:

DynamicValue::Pipeline::Pipeline(Pipeline&& other) noexcept: type(other.type) {
  switch (type) {
    case UNKNOWN: break;
    case STRUCT: kj::ctor(structValue, kj::mv(other.structValue)); break;
    case CAPABILITY: kj::ctor(capabilityValue, kj::mv(other.capabilityValue)); break;
    default:
      KJ_LOG(ERROR, "Unexpected pipeline type.", (uint)type);
      type = UNKNOWN;
      break;
  }
}